

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_linkedsectors.cpp
# Opt level: O3

void AddSingleSector(plane *scrollplane,sector_t_conflict *sector,int movetype)

{
  uint *puVar1;
  byte *pbVar2;
  FLinkedSector *pFVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(scrollplane->Sectors).Count;
  if (uVar6 != 0) {
    pFVar3 = (scrollplane->Sectors).Array;
    lVar4 = 0;
    do {
      if (*(sector_t_conflict **)((long)&pFVar3->Sector + lVar4) == sector) {
        if ((movetype & 5U) != 0) {
          pbVar2 = (byte *)((long)&pFVar3->Type + lVar4);
          *pbVar2 = *pbVar2 & 0xfa;
        }
        uVar5 = *(uint *)((long)&pFVar3->Type + lVar4);
        if ((movetype & 10U) != 0) {
          uVar5 = uVar5 & 0xfffffff5;
          *(uint *)((long)&pFVar3->Type + lVar4) = uVar5;
        }
        *(uint *)((long)&pFVar3->Type + lVar4) = uVar5 | movetype;
        return;
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar6 << 4 != lVar4);
  }
  TArray<FLinkedSector,_FLinkedSector>::Grow(&scrollplane->Sectors,1);
  pFVar3 = (scrollplane->Sectors).Array;
  uVar5 = (scrollplane->Sectors).Count;
  pFVar3[uVar5].Sector = sector;
  pFVar3[uVar5].Type = movetype;
  puVar1 = &(scrollplane->Sectors).Count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

static void AddSingleSector(extsector_t::linked::plane &scrollplane, sector_t *sector, int movetype)
{
	// First we have to check the list if the sector is already in it
	// If so the move type must be adjusted

	for(unsigned i = 0; i < scrollplane.Sectors.Size(); i++)
	{
		if (scrollplane.Sectors[i].Sector == sector)
		{
			if (movetype & LINK_FLOORBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_FLOORBITS;
			}

			if (movetype & LINK_CEILINGBITS)
			{
				scrollplane.Sectors[i].Type &= ~LINK_CEILINGBITS;
			}

			scrollplane.Sectors[i].Type |= movetype;
			return;
		}
	}

	// The sector hasn't been attached yet so do it now

	FLinkedSector newlink = {sector, movetype};
	scrollplane.Sectors.Push(newlink);
}